

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

TPZVec<TPZEqnArray<long_double>_> * __thiscall
TPZVec<TPZEqnArray<long_double>_>::operator=
          (TPZVec<TPZEqnArray<long_double>_> *this,TPZVec<TPZEqnArray<long_double>_> *rval)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  TPZEqnArray<long_double> *pTVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  void *pvVar6;
  long lVar7;
  TPZEqnArray<long_double> *pTVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  
  if (this != rval) {
    this->fNElements = rval->fNElements;
    pTVar3 = this->fStore;
    if (pTVar3 != (TPZEqnArray<long_double> *)0x0) {
      lVar9 = *(long *)&pTVar3[-1].field_0x51d8;
      if (lVar9 != 0) {
        lVar7 = lVar9 * 0x51e0;
        do {
          TPZEqnArray<long_double>::~TPZEqnArray
                    ((TPZEqnArray<long_double> *)
                     ((long)pTVar3[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                     lVar7 + -0x28));
          lVar7 = lVar7 + -0x51e0;
        } while (lVar7 != 0);
      }
      operator_delete__(&pTVar3[-1].fLastTerm,lVar9 * 0x51e0 | 0x10);
    }
    if (rval->fNAlloc == 0) {
      uVar4 = this->fNElements;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar4;
      uVar11 = 0xffffffffffffffff;
      if (SUB168(auVar5 * ZEXT816(0x51e0),8) == 0) {
        uVar11 = SUB168(auVar5 * ZEXT816(0x51e0),0) | 0x10;
      }
      pvVar6 = operator_new__(uVar11);
      *(ulong *)((long)pvVar6 + 8) = uVar4;
      pTVar3 = (TPZEqnArray<long_double> *)((long)pvVar6 + 0x10);
      if (uVar4 == 0) {
        this->fStore = pTVar3;
        lVar9 = 0;
      }
      else {
        lVar9 = 0;
        pTVar8 = pTVar3;
        do {
          TPZEqnArray<long_double>::TPZEqnArray(pTVar8);
          lVar9 = lVar9 + -0x51e0;
          pTVar8 = pTVar8 + 1;
        } while (uVar4 * -0x51e0 - lVar9 != 0);
        lVar9 = this->fNElements;
        this->fStore = pTVar3;
        if (0 < lVar9) {
          lVar10 = 0;
          lVar7 = 0;
          do {
            pTVar3 = rval->fStore;
            pTVar8 = this->fStore;
            puVar1 = (undefined8 *)
                     ((long)(pTVar3->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                     lVar10 + -0x28);
            puVar2 = (undefined8 *)
                     ((long)(pTVar8->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                     lVar10 + -0x28);
            *puVar2 = *puVar1;
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)(puVar2 + 1),(TPZManVector<int,_100> *)(puVar1 + 1)
                      );
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)
                       ((long)(pTVar8->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                       lVar10 + -0x20),
                       (TPZManVector<int,_100> *)
                       ((long)(pTVar3->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                       lVar10 + -0x20));
            TPZManVector<long_double,_1000>::operator=
                      ((TPZManVector<long_double,_1000> *)
                       ((long)(pTVar8->fEqValues).super_TPZManVector<long_double,_1000>.fExtAlloc +
                       lVar10 + -0x20),
                       (TPZManVector<long_double,_1000> *)
                       ((long)(pTVar3->fEqValues).super_TPZManVector<long_double,_1000>.fExtAlloc +
                       lVar10 + -0x20));
            TPZManVector<int,_1000>::operator=
                      ((TPZManVector<int,_1000> *)
                       ((long)(pTVar8->fIndex).super_TPZManVector<int,_1000>.fExtAlloc +
                       lVar10 + -0x20),
                       (TPZManVector<int,_1000> *)
                       ((long)(pTVar3->fIndex).super_TPZManVector<int,_1000>.fExtAlloc +
                       lVar10 + -0x20));
            *(undefined4 *)(puVar2 + 0xa3a) = *(undefined4 *)(puVar1 + 0xa3a);
            lVar7 = lVar7 + 1;
            lVar9 = this->fNElements;
            lVar10 = lVar10 + 0x51e0;
          } while (lVar7 < lVar9);
        }
      }
    }
    else {
      this->fStore = rval->fStore;
      lVar9 = this->fNElements;
    }
    this->fNAlloc = lVar9;
    rval->fStore = (TPZEqnArray<long_double> *)0x0;
    rval->fNElements = 0;
    rval->fNAlloc = 0;
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(TPZVec<T> &&rval){
	if(this != &rval){
        fNElements = rval.fNElements;
        if(fStore) delete [] fStore;
        if(rval.fNAlloc){
            fStore = rval.fStore;
        }else{
            fStore = new T[fNElements];
            for (int64_t i = 0; i < fNElements; i++)
                fStore[i] = rval.fStore[i];
        }
        fNAlloc = fNElements;//perhaps rval.fNalloc was 0
        rval.fStore = nullptr;
        rval.fNElements = 0;
        rval.fNAlloc = 0;
	}
	return *this;
}